

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O1

void __thiscall wasm::Literal::Literal(Literal *this,Name func,HeapType type)

{
  int iVar1;
  HeapType type_local;
  
  (this->field_0).i64 = func.super_IString.str._M_len;
  (this->field_0).func.super_IString.str._M_str = func.super_IString.str._M_str;
  (this->type).id = type.id;
  if (((uint)(0x7c < type.id) * 4 + 3 & (uint)type.id) != 0) {
    __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
  }
  iVar1 = wasm::HeapType::getKind();
  if (iVar1 == 1) {
    return;
  }
  __assert_fail("type.isSignature()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                ,0x5c,"wasm::Literal::Literal(Name, HeapType)");
}

Assistant:

explicit Literal(Name func, HeapType type)
    : func(func), type(type, NonNullable) {
    assert(type.isSignature());
  }